

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlSetVertexAttributeDefault(int locIndex,void *value,int attribType,int count)

{
  switch(attribType) {
  case 0:
    if (count == 1) {
      (*glad_glVertexAttrib1fv)(locIndex,(GLfloat *)value);
      return;
    }
    break;
  case 1:
    if (count == 2) {
      (*glad_glVertexAttrib2fv)(locIndex,(GLfloat *)value);
      return;
    }
    break;
  case 2:
    if (count == 3) {
      (*glad_glVertexAttrib3fv)(locIndex,(GLfloat *)value);
      return;
    }
    break;
  case 3:
    if (count == 4) {
      (*glad_glVertexAttrib4fv)(locIndex,(GLfloat *)value);
      return;
    }
    break;
  default:
    TraceLog(4,"SHADER: Failed to set attrib default value, data type not recognized");
    return;
  }
  return;
}

Assistant:

void rlSetVertexAttributeDefault(int locIndex, const void *value, int attribType, int count)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    switch (attribType)
    {
        case SHADER_ATTRIB_FLOAT: if (count == 1) glVertexAttrib1fv(locIndex, (float *)value); break;
        case SHADER_ATTRIB_VEC2: if (count == 2) glVertexAttrib2fv(locIndex, (float *)value); break;
        case SHADER_ATTRIB_VEC3: if (count == 3) glVertexAttrib3fv(locIndex, (float *)value); break;
        case SHADER_ATTRIB_VEC4: if (count == 4) glVertexAttrib4fv(locIndex, (float *)value); break;
        default: TRACELOG(LOG_WARNING, "SHADER: Failed to set attrib default value, data type not recognized");
    }
#endif
}